

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManIsoStrashReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Wec_t *vSupps;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar4;
  Vec_Ptr_t *p_02;
  int fVerbose_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int i;
  
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  p_00 = Gia_ManIsoStrashReduceInt(p,vSupps,fVerbose_00);
  uVar6 = p_00->nSize;
  pVVar3 = Vec_IntAlloc(uVar6);
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    p_01 = Vec_WecEntry(p_00,uVar5);
    if (0 < p_01->nSize) {
      iVar1 = Vec_IntEntry(p_01,0);
      Vec_IntPush(pVVar3,iVar1);
    }
  }
  pGVar4 = Gia_ManDupCones(p,pVVar3->pArray,pVVar3->nSize,0);
  Vec_IntFree(pVVar3);
  Vec_WecFree(vSupps);
  if (fVerbose != 0) {
    puts("Nontrivial classes:");
    for (uVar5 = 0; uVar5 != uVar7; uVar5 = uVar5 + 1) {
      pVVar3 = Vec_WecEntry(p_00,uVar5);
      if (pVVar3->nSize != 1) {
        printf(" %4d : {",(ulong)uVar5);
        for (iVar1 = 0; iVar1 < pVVar3->nSize; iVar1 = iVar1 + 1) {
          uVar2 = Vec_IntEntry(pVVar3,iVar1);
          printf(" %d",(ulong)uVar2);
        }
        puts(" }");
      }
    }
  }
  if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
    p_02 = Vec_PtrAlloc(uVar6);
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pVVar3 = Vec_WecEntry(p_00,uVar6);
      pVVar3 = Vec_IntDup(pVVar3);
      Vec_PtrPush(p_02,pVVar3);
    }
    *pvPosEquivs = p_02;
  }
  Vec_WecFree(p_00);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Vec_Wec_t * vPosEquivs = Gia_ManIsoStrashReduceInt( p, vSupps, fVerbose );
    // find the first outputs and derive GIA
    Vec_Int_t * vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    Gia_Man_t * pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    Vec_WecFree( vSupps );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}